

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_ref_t art_node16_insert(art_t *art,art_node16_t *node,art_ref_t child,uint8_t key)

{
  size_t __n;
  art_node48_t *paVar1;
  byte in_CL;
  art_t *in_RDX;
  art_t *in_RSI;
  size_t i;
  art_node48_t *new_node;
  size_t after;
  size_t idx;
  art_node_t *in_stack_ffffffffffffffb8;
  art_t *in_stack_ffffffffffffffc0;
  art_node_t *in_stack_ffffffffffffffc8;
  art_t *in_stack_ffffffffffffffd0;
  ulong uVar2;
  undefined7 in_stack_ffffffffffffffd8;
  art_ref_t local_8;
  
  if (*(byte *)((long)&in_RSI->root + 6) < 0x10) {
    for (uVar2 = 0;
        (uVar2 < *(byte *)((long)&in_RSI->root + 6) &&
        (*(byte *)((long)in_RSI->first_free + (uVar2 - 1)) <= in_CL)); uVar2 = uVar2 + 1) {
    }
    __n = *(byte *)((long)&in_RSI->root + 6) - uVar2;
    memmove((void *)((long)in_RSI->first_free + uVar2),
            (void *)((long)in_RSI->first_free + (uVar2 - 1)),__n);
    memmove(in_RSI->first_free + uVar2 + 3,in_RSI->first_free + uVar2 + 2,__n << 3);
    in_RSI->first_free[uVar2 + 2] = (uint64_t)in_RDX;
    *(byte *)((long)in_RSI->first_free + (uVar2 - 1)) = in_CL;
    *(char *)((long)&in_RSI->root + 6) = *(char *)((long)&in_RSI->root + 6) + '\x01';
    local_8 = art_get_ref(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,'\0');
  }
  else {
    paVar1 = art_node48_create(in_RDX,(art_key_chunk_t *)CONCAT17(in_CL,in_stack_ffffffffffffffd8),
                               (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38));
    for (uVar2 = 0; uVar2 < 0x10; uVar2 = uVar2 + 1) {
      art_node48_insert(in_RSI,(art_node48_t *)in_RDX,CONCAT17(in_CL,in_stack_ffffffffffffffd8),
                        (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38));
    }
    art_node_free(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                  (art_typecode_t)((ulong)paVar1 >> 0x38));
    local_8 = art_node48_insert(in_RSI,(art_node48_t *)in_RDX,
                                CONCAT17(in_CL,in_stack_ffffffffffffffd8),
                                (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38));
  }
  return local_8;
}

Assistant:

static art_ref_t art_node16_insert(art_t *art, art_node16_t *node,
                                   art_ref_t child, uint8_t key) {
    if (node->count < 16) {
        size_t idx = 0;
        for (; idx < node->count; ++idx) {
            if (node->keys[idx] > key) {
                break;
            }
        }
        size_t after = node->count - idx;
        // Shift other keys to maintain sorted order.
        memmove(node->keys + idx + 1, node->keys + idx,
                after * sizeof(art_key_chunk_t));
        memmove(node->children + idx + 1, node->children + idx,
                after * sizeof(art_ref_t));

        node->children[idx] = child;
        node->keys[idx] = key;
        node->count++;
        return art_get_ref(art, (art_node_t *)node, CROARING_ART_NODE16_TYPE);
    }
    art_node48_t *new_node =
        art_node48_create(art, node->base.prefix, node->base.prefix_size);
    for (size_t i = 0; i < 16; ++i) {
        art_node48_insert(art, new_node, node->children[i], node->keys[i]);
    }
    art_node_free(art, (art_node_t *)node, CROARING_ART_NODE16_TYPE);
    return art_node48_insert(art, new_node, child, key);
}